

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_utf_validate(nk_rune *u,int i)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  if (u != (nk_rune *)0x0) {
    uVar4 = *u;
    if (((uVar4 < nk_utfmin[i]) || ((uVar4 & 0xfffff800) == 0xd800)) || (nk_utfmax[i] < uVar4)) {
      *u = 0xfffd;
      uVar4 = 0xfffd;
    }
    lVar2 = 0;
    do {
      lVar3 = lVar2 + 1;
      lVar1 = lVar2 + 1;
      lVar2 = lVar3;
    } while (nk_utfmax[lVar1] < uVar4);
    return (int)lVar3;
  }
  return 0;
}

Assistant:

NK_INTERN int
nk_utf_validate(nk_rune *u, int i)
{
    NK_ASSERT(u);
    if (!u) return 0;
    if (!NK_BETWEEN(*u, nk_utfmin[i], nk_utfmax[i]) ||
         NK_BETWEEN(*u, 0xD800, 0xDFFF))
            *u = NK_UTF_INVALID;
    for (i = 1; *u > nk_utfmax[i]; ++i);
    return i;
}